

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::MultisampleRenderer::MultisampleRenderer
          (MultisampleRenderer *this,Context *context,VkFormat colorFormat,IVec2 *renderSize,
          VkPrimitiveTopology topology,
          vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *vertices,
          VkPipelineMultisampleStateCreateInfo *multisampleStateParams,
          VkPipelineColorBlendAttachmentState *blendState)

{
  void *pvVar1;
  VkBool32 VVar2;
  VkBool32 VVar3;
  VkPipelineMultisampleStateCreateFlags VVar4;
  VkSampleCountFlagBits VVar5;
  VkBool32 VVar6;
  float fVar7;
  VkStructureType VVar8;
  undefined4 uVar9;
  VkBlendFactor VVar10;
  VkBlendOp VVar11;
  VkColorComponentFlags VVar12;
  VkBlendFactor VVar13;
  VkBlendFactor VVar14;
  VkBlendOp VVar15;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *vertices_local;
  IVec2 *pIStack_28;
  VkPrimitiveTopology topology_local;
  IVec2 *renderSize_local;
  Context *pCStack_18;
  VkFormat colorFormat_local;
  Context *context_local;
  MultisampleRenderer *this_local;
  
  this->_vptr_MultisampleRenderer = (_func_int **)&PTR__MultisampleRenderer_016a4ad8;
  this->m_context = context;
  this->m_colorFormat = colorFormat;
  this->m_depthStencilFormat = VK_FORMAT_UNDEFINED;
  vertices_local._4_4_ = topology;
  pIStack_28 = renderSize;
  renderSize_local._4_4_ = colorFormat;
  pCStack_18 = context;
  context_local = (Context *)this;
  tcu::Vector<int,_2>::Vector(&this->m_renderSize,renderSize);
  this->m_useDepth = false;
  this->m_useStencil = false;
  VVar8 = multisampleStateParams->sType;
  uVar9 = *(undefined4 *)&multisampleStateParams->field_0x4;
  pvVar1 = multisampleStateParams->pNext;
  VVar4 = multisampleStateParams->flags;
  VVar5 = multisampleStateParams->rasterizationSamples;
  VVar6 = multisampleStateParams->sampleShadingEnable;
  fVar7 = multisampleStateParams->minSampleShading;
  VVar2 = multisampleStateParams->alphaToCoverageEnable;
  VVar3 = multisampleStateParams->alphaToOneEnable;
  (this->m_multisampleStateParams).pSampleMask = multisampleStateParams->pSampleMask;
  (this->m_multisampleStateParams).alphaToCoverageEnable = VVar2;
  (this->m_multisampleStateParams).alphaToOneEnable = VVar3;
  (this->m_multisampleStateParams).flags = VVar4;
  (this->m_multisampleStateParams).rasterizationSamples = VVar5;
  (this->m_multisampleStateParams).sampleShadingEnable = VVar6;
  (this->m_multisampleStateParams).minSampleShading = fVar7;
  (this->m_multisampleStateParams).sType = VVar8;
  *(undefined4 *)&(this->m_multisampleStateParams).field_0x4 = uVar9;
  (this->m_multisampleStateParams).pNext = pvVar1;
  VVar2 = blendState->blendEnable;
  VVar13 = blendState->srcColorBlendFactor;
  VVar14 = blendState->dstColorBlendFactor;
  VVar15 = blendState->colorBlendOp;
  VVar10 = blendState->dstAlphaBlendFactor;
  VVar11 = blendState->alphaBlendOp;
  VVar12 = blendState->colorWriteMask;
  (this->m_colorBlendState).srcAlphaBlendFactor = blendState->srcAlphaBlendFactor;
  (this->m_colorBlendState).dstAlphaBlendFactor = VVar10;
  (this->m_colorBlendState).alphaBlendOp = VVar11;
  (this->m_colorBlendState).colorWriteMask = VVar12;
  (this->m_colorBlendState).blendEnable = VVar2;
  (this->m_colorBlendState).srcColorBlendFactor = VVar13;
  (this->m_colorBlendState).dstColorBlendFactor = VVar14;
  (this->m_colorBlendState).colorBlendOp = VVar15;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::Move(&this->m_colorImage);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (&this->m_colorImageAlloc);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(&this->m_colorAttachmentView);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::Move(&this->m_resolveImage);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (&this->m_resolveImageAlloc);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(&this->m_resolveAttachmentView);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::Move(&this->m_depthStencilImage);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (&this->m_depthStencilImageAlloc);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(&this->m_depthStencilAttachmentView)
  ;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::Move(&this->m_renderPass);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::Move(&this->m_framebuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::Move(&this->m_vertexShaderModule);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::Move(&this->m_fragmentShaderModule);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move(&this->m_vertexBuffer);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (&this->m_vertexBufferAlloc);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::Move(&this->m_pipelineLayout);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::vector(&this->m_graphicsPipelines);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::Move(&this->m_cmdPool);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::Move(&this->m_cmdBuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::Move(&this->m_fence);
  initialize(this,pCStack_18,1,(VkPrimitiveTopology *)((long)&vertices_local + 4),vertices);
  return;
}

Assistant:

MultisampleRenderer::MultisampleRenderer (Context&										context,
										  const VkFormat								colorFormat,
										  const tcu::IVec2&								renderSize,
										  const VkPrimitiveTopology						topology,
										  const std::vector<Vertex4RGBA>&				vertices,
										  const VkPipelineMultisampleStateCreateInfo&	multisampleStateParams,
										  const VkPipelineColorBlendAttachmentState&	blendState)
	: m_context					(context)
	, m_colorFormat				(colorFormat)
	, m_depthStencilFormat		(VK_FORMAT_UNDEFINED)
	, m_renderSize				(renderSize)
	, m_useDepth				(false)
	, m_useStencil				(false)
	, m_multisampleStateParams	(multisampleStateParams)
	, m_colorBlendState			(blendState)
{
	initialize(context, 1u, &topology, &vertices);
}